

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O2

void __thiscall vw_ostream::vw_ostream(vw_ostream *this)

{
  std::ios::ios((ios *)&(this->super_ostream).field_0x88);
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x2b2e60;
  *(undefined8 *)&(this->super_ostream).field_0x88 = 0x2b2e88;
  std::ostream::ostream(this,(streambuf *)&PTR_construction_vtable_24__002b2ea0);
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x2b2e60;
  *(undefined8 *)&(this->super_ostream).field_0x88 = 0x2b2e88;
  vw_streambuf::vw_streambuf((vw_streambuf *)&(this->super_ostream).field_0x8,this);
  *(undefined8 *)&(this->super_ostream).field_0x78 = 0;
  *(code **)&(this->super_ostream).field_0x80 = trace_listener_cerr;
  return;
}

Assistant:

vw_ostream::vw_ostream() : std::ostream(&buf), buf(*this), trace_context(nullptr)
{
  trace_listener = trace_listener_cerr;
}